

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

char double_conversion::anon_unknown_0::ToLower(char ch)

{
  int iVar1;
  locale *plVar2;
  char in_DIL;
  
  if ((anonymous_namespace)::ToLower(char)::cType == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType);
    if (iVar1 != 0) {
      plVar2 = (locale *)std::locale::classic();
      ToLower::cType = (ctype<char> *)std::use_facet<std::ctype<char>>(plVar2);
      __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
    }
  }
  iVar1 = std::ctype<char>::tolower(ToLower::cType,(int)in_DIL);
  return (char)iVar1;
}

Assistant:

inline char ToLower(char ch) {
  static const std::ctype<char>& cType =
      std::use_facet<std::ctype<char> >(std::locale::classic());
  return cType.tolower(ch);
}